

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper3.cpp
# Opt level: O2

void test_cpp_wrapper_open_close_all(planck_unit_test_t *tc)

{
  Dictionary<int,_int> *pDVar1;
  
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  BppTree<int,_int>::BppTree((BppTree<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4);
  cpp_wrapper_open_close(tc,pDVar1,0x42,0xc);
  Dictionary<int,_int>::~Dictionary(pDVar1);
  operator_delete(pDVar1);
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  FlatFile<int,_int>::FlatFile((FlatFile<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,0xf);
  cpp_wrapper_open_close(tc,pDVar1,0x2d,0xe);
  Dictionary<int,_int>::~Dictionary(pDVar1);
  operator_delete(pDVar1);
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  OpenAddressHash<int,_int>::OpenAddressHash
            ((OpenAddressHash<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,0x32);
  cpp_wrapper_open_close(tc,pDVar1,3,0xf);
  Dictionary<int,_int>::~Dictionary(pDVar1);
  operator_delete(pDVar1);
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  OpenAddressFileHash<int,_int>::OpenAddressFileHash
            ((OpenAddressFileHash<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,0x32);
  cpp_wrapper_open_close(tc,pDVar1,5,0xc);
  Dictionary<int,_int>::~Dictionary(pDVar1);
  operator_delete(pDVar1);
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  SkipList<int,_int>::SkipList((SkipList<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,7);
  cpp_wrapper_open_close(tc,pDVar1,1,0xd);
  Dictionary<int,_int>::~Dictionary(pDVar1);
  operator_delete(pDVar1);
  return;
}

Assistant:

void
test_cpp_wrapper_open_close_all(
	planck_unit_test_t *tc
) {
	Dictionary<int, int> *dict;

	dict = new BppTree<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int));
	cpp_wrapper_open_close(tc, dict, 66, 12);
	delete dict;

	dict = new FlatFile<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 15);
	cpp_wrapper_open_close(tc, dict, 45, 14);
	delete dict;

	dict = new OpenAddressHash<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	cpp_wrapper_open_close(tc, dict, 3, 15);
	delete dict;

	dict = new OpenAddressFileHash<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	cpp_wrapper_open_close(tc, dict, 5, 12);
	delete dict;

	dict = new SkipList<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 7);
	cpp_wrapper_open_close(tc, dict, 1, 13);
	delete dict;

/*	dict = new LinearHash<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 7); */
/*	cpp_wrapper_open_close(tc, dict, 2, 22); */
/*	delete dict; */
}